

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O1

DdNode * addBddDoStrictThreshold(DdManager *dd,DdNode *f,DdNode *val)

{
  int *piVar1;
  DdHalfWord index;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *T;
  
  if (f->index == 0x7fffffff) {
    return (DdNode *)((ulong)((f->type).value <= (val->type).value) ^ (ulong)dd->one);
  }
  pDVar2 = cuddCacheLookup2(dd,addBddDoStrictThreshold,f,val);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  index = f->index;
  pDVar2 = (f->type).kids.E;
  n = addBddDoStrictThreshold(dd,(f->type).kids.T,val);
  if (n != (DdNode *)0x0) {
    T = (DdNode *)((ulong)n & 0xfffffffffffffffe);
    T->ref = T->ref + 1;
    pDVar2 = addBddDoStrictThreshold(dd,pDVar2,val);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (((ulong)n & 1) == 0) {
        pDVar3 = n;
        if (n != pDVar2) {
          pDVar3 = cuddUniqueInter(dd,index,n,pDVar2);
        }
        if (pDVar3 != (DdNode *)0x0) {
LAB_007fbf5a:
          T->ref = T->ref - 1;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(dd,addBddDoStrictThreshold,f,val,pDVar3);
          return pDVar3;
        }
        Cudd_RecursiveDeref(dd,n);
        n = pDVar2;
      }
      else {
        pDVar3 = T;
        if (n != pDVar2) {
          pDVar3 = cuddUniqueInter(dd,index,T,(DdNode *)((ulong)pDVar2 ^ 1));
        }
        if (pDVar3 != (DdNode *)0x0) {
          pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
          goto LAB_007fbf5a;
        }
        Cudd_RecursiveDeref(dd,n);
        n = pDVar2;
      }
    }
    Cudd_RecursiveDeref(dd,n);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
addBddDoStrictThreshold(
  DdManager * dd,
  DdNode * f,
  DdNode * val)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        return(Cudd_NotCond(DD_ONE(dd),cuddV(f) <= cuddV(val)));
    }

    /* Check cache. */
    res = cuddCacheLookup2(dd,addBddDoStrictThreshold,f,val);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addBddDoStrictThreshold(dd,fv,val);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addBddDoStrictThreshold(dd,fvn,val);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);
    if (Cudd_IsComplement(T)) {
        res = (T == E) ? Cudd_Not(T) : cuddUniqueInter(dd,v,Cudd_Not(T),Cudd_Not(E));
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,addBddDoStrictThreshold,f,val,res);

    return(res);

}